

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void __thiscall absl::base_internal::anon_unknown_0::ArenaLock::Leave(ArenaLock *this)

{
  uint uVar1;
  
  SpinLock::Unlock(&this->arena_->mu);
  if (this->mask_valid_ == true) {
    uVar1 = pthread_sigmask(2,(__sigset_t *)&this->mask_,(__sigset_t *)0x0);
    if (uVar1 != 0) {
      raw_logging_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x12d,"pthread_sigmask failed: %d",(ulong)uVar1);
    }
  }
  this->left_ = true;
  return;
}

Assistant:

void Leave() ABSL_UNLOCK_FUNCTION() {
    arena_->mu.Unlock();
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if (mask_valid_) {
      const int err = pthread_sigmask(SIG_SETMASK, &mask_, nullptr);
      if (err != 0) {
        ABSL_RAW_LOG(FATAL, "pthread_sigmask failed: %d", err);
      }
    }
#endif
    left_ = true;
  }